

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CmdLineParser.cpp
# Opt level: O2

bool axl::sl::CmdLineParserRoot::parseSwitch
               (ArgKind argKind,StringRef *arg,String *switchName,String *value)

{
  EVP_PKEY_CTX EVar1;
  EVP_PKEY_CTX *dst;
  int iVar2;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *pEVar3;
  EVP_PKEY_CTX *pEVar4;
  
  dst = (EVP_PKEY_CTX *)arg->m_p;
  pEVar4 = dst + arg->m_length;
  if (argKind == ArgKind_CharSwitch) {
    StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
              (switchName,(EVP_PKEY_CTX *)(ulong)(uint)(int)(char)*dst,(EVP_PKEY_CTX *)switchName);
    pEVar3 = dst + 1;
  }
  else {
    src = (EVP_PKEY_CTX *)0x0;
    while (((pEVar3 = dst + (long)src, pEVar3 < pEVar4 && ((char)*pEVar3 != 0x3d)) &&
           (iVar2 = isspace((int)(char)*pEVar3), iVar2 == 0))) {
      src = src + 1;
    }
    StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy(switchName,dst,src);
  }
  if (pEVar3 < pEVar4) {
    EVar1 = *pEVar3;
    iVar2 = isspace((int)(char)EVar1);
    if (iVar2 == 0) {
      StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
                (value,pEVar3 + (EVar1 == (EVP_PKEY_CTX)0x3d),
                 pEVar4 + -(long)(pEVar3 + (EVar1 == (EVP_PKEY_CTX)0x3d)));
      return true;
    }
  }
  StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear(value);
  return true;
}

Assistant:

bool
CmdLineParserRoot::parseSwitch(
	ArgKind argKind,
	const sl::StringRef& arg,
	sl::String* switchName,
	sl::String* value
) {
	const char* p = arg.cp();
	const char* end = arg.getEnd();

	if (argKind == ArgKind_CharSwitch) {
		switchName->copy(*p);
		p++;
	} else {
		const char* p0 = p;
		while (p < end && *p != '=' && !isspace(*p))
			p++;

		switchName->copy(p0, p - p0);
	}

	if (p < end && !isspace(*p)) { // has value
		if (*p == '=')
			p++;

		value->copy(p, end - p);
	} else {
		value->clear();
	}

	return true;
}